

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O3

int __thiscall WaitableSafeQueue<int>::pop(WaitableSafeQueue<int> *this)

{
  bool bVar1;
  int iVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_mtx;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  while( true ) {
    bVar1 = SafeQueue<int>::empty((SafeQueue<int> *)this);
    if (!bVar1) break;
    std::condition_variable::wait((unique_lock *)&this->m_cond);
  }
  iVar2 = SafeQueue<int>::pop((SafeQueue<int> *)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return iVar2;
}

Assistant:

T pop() override
    {
        std::unique_lock lk(m_mtx);

        while (SafeQueue<T>::empty())
        {
            m_cond.wait(lk);
        }

        T val = SafeQueue<T>::pop();

        return val;
    }